

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::subSatUI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  uint uVar1;
  
  if (((this->type).id == 2) && ((other->type).id == 2)) {
    uVar1 = (uint)(byte)((this->field_0).v128[0] - (other->field_0).v128[0]);
    if ((this->field_0).v128[0] < (other->field_0).v128[0]) {
      uVar1 = 0;
    }
    *(uint *)&__return_storage_ptr__->field_0 = uVar1;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal Literal::subSatUI8(const Literal& other) const {
  return Literal(sub_sat_u<uint8_t>(geti32(), other.geti32()));
}